

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

Aig_Man_t * Aig_ManDupNodesAll(Aig_Man_t *p,Vec_Ptr_t *vSet)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Man_t *p_01;
  char *pcVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  Aig_Obj_t *p1;
  Aig_Man_t *pAVar6;
  int local_34;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pCopy;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vSet_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_01 = Aig_ManStart(iVar1);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar2;
  pAVar3 = Aig_ManConst1(p_01);
  pAVar4 = Aig_ManConst1(p);
  (pAVar4->field_5).pData = pAVar3;
  for (local_34 = 0; iVar1 = Vec_PtrSize(p->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar5 = Vec_PtrEntry(p->vCis,local_34);
    pAVar3 = Aig_ObjCreateCi(p_01);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_34);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      p1 = Aig_ObjChild1Copy(pAVar3);
      pAVar4 = Aig_And(p_01,pAVar4,p1);
      (pAVar3->field_5).pData = pAVar4;
    }
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(vSet), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vSet,local_34);
    pAVar3 = Aig_Regular(pAVar4);
    pAVar3 = (Aig_Obj_t *)(pAVar3->field_5).pData;
    iVar1 = Aig_IsComplement(pAVar4);
    pAVar3 = Aig_NotCond(pAVar3,iVar1);
    Aig_ObjCreateCo(p_01,pAVar3);
  }
  for (local_34 = 0; iVar1 = Saig_ManRegNum(p), local_34 < iVar1; local_34 = local_34 + 1) {
    p_00 = p->vCos;
    iVar1 = Saig_ManPoNum(p);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_34 + iVar1);
    pAVar4 = Aig_ObjChild0Copy(pAVar3);
    pAVar4 = Aig_ObjCreateCo(p_01,pAVar4);
    (pAVar3->field_5).pData = pAVar4;
  }
  iVar1 = Saig_ManRegNum(p);
  Aig_ManSetRegNum(p_01,iVar1);
  Aig_ManSeqCleanup(p_01);
  pAVar6 = Aig_ManDupSimpleDfs(p_01);
  Aig_ManStop(p_01);
  return pAVar6;
}

Assistant:

Aig_Man_t * Aig_ManDupNodesAll( Aig_Man_t * p, Vec_Ptr_t * vSet )
{
    Aig_Man_t * pNew, * pCopy;
    Aig_Obj_t * pObj;
    int i;
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
//    Saig_ManForEachPo( p, pObj, i )
//        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vSet, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)Aig_Regular(pObj)->pData, Aig_IsComplement(pObj)) );
    Saig_ManForEachLi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManSetRegNum( pNew, Saig_ManRegNum(p) );
    // cleanup and return a copy
    Aig_ManSeqCleanup( pNew );
    pCopy = Aig_ManDupSimpleDfs( pNew );
    Aig_ManStop( pNew );
    return pCopy;
}